

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

bool __thiscall CConnman::ForNode(CConnman *this,NodeId id,function<bool_(CNode_*)> func)

{
  pointer ppCVar1;
  pointer ppCVar2;
  undefined1 uVar3;
  CNode *pCVar4;
  undefined8 uVar5;
  long in_RDX;
  pointer ppCVar6;
  long in_FS_OFFSET;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_device = &(this->m_nodes_mutex).super_recursive_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_30);
  ppCVar1 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar2 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar1 == ppCVar2) {
    pCVar4 = (CNode *)0x0;
  }
  else {
    do {
      ppCVar6 = ppCVar1 + 1;
      pCVar4 = *ppCVar1;
      if ((*ppCVar1)->id == id) break;
      pCVar4 = (CNode *)0x0;
      ppCVar1 = ppCVar6;
    } while (ppCVar6 != ppCVar2);
  }
  if (((pCVar4 == (CNode *)0x0) || (((pCVar4->fSuccessfullyConnected)._M_base._M_i & 1U) == 0)) ||
     (((pCVar4->fDisconnect)._M_base._M_i & 1U) != 0)) {
    uVar3 = 0;
  }
  else {
    if (*(long *)(in_RDX + 0x10) == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        uVar5 = std::__throw_bad_function_call();
        std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          _Unwind_Resume(uVar5);
        }
      }
      goto LAB_001b116f;
    }
    uVar3 = (**(code **)(in_RDX + 0x18))();
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (bool)uVar3;
  }
LAB_001b116f:
  __stack_chk_fail();
}

Assistant:

bool CConnman::ForNode(NodeId id, std::function<bool(CNode* pnode)> func)
{
    CNode* found = nullptr;
    LOCK(m_nodes_mutex);
    for (auto&& pnode : m_nodes) {
        if(pnode->GetId() == id) {
            found = pnode;
            break;
        }
    }
    return found != nullptr && NodeFullyConnected(found) && func(found);
}